

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

int fy_fetch_block_entry(fy_parser *fyp,int c)

{
  fy_token *pfVar1;
  _Bool _Var2;
  fy_atom *pfVar3;
  fy_atom *pfVar4;
  fy_simple_key *pfVar5;
  char *pcVar6;
  fy_atom fStack_1d8;
  undefined8 uStack_1a0;
  undefined1 auStack_198 [8];
  fy_parser *local_190;
  fy_parser *local_188;
  fy_token_list *local_180;
  undefined1 auStack_178 [8];
  fy_diag_report_ctx _drc_6;
  undefined1 local_148 [8];
  fy_diag_report_ctx _drc_5;
  fy_diag_report_ctx _drc_4;
  fy_diag_report_ctx _drc_3;
  undefined1 auStack_c8 [8];
  fy_diag_report_ctx _drc_2;
  undefined1 auStack_98 [8];
  fy_diag_report_ctx _drc_1;
  undefined1 auStack_68 [8];
  fy_diag_report_ctx _drc;
  fy_token *fyt;
  fy_simple_key *fysk;
  fy_mark mark;
  int rc;
  int c_local;
  fy_parser *fyp_local;
  
  mark.column = c;
  if (c == 0x2d) {
    if ((fyp->flow_level == 0) || (fyp->indent < fyp->column + 2)) {
      if ((fyp->flow_level == 0) && ((*(ushort *)&fyp->field_0x70 >> 3 & 1) == 0)) {
        if (((*(ushort *)&fyp->field_0x70 >> 3 & 1) == 0) &&
           (fyp->state == FYPS_BLOCK_MAPPING_VALUE)) {
          _drc_1.fyt = (fy_token *)0x0;
          _drc_1.has_override = false;
          _drc_1._17_7_ = 0;
          _drc_1.type = FYET_DEBUG;
          _drc_1.module = FYEM_UNKNOWN;
          _drc_1.override_file = (char *)0x0;
          auStack_98._0_4_ = FYET_ERROR;
          auStack_98._4_4_ = FYEM_SCAN;
          pfVar3 = fy_fill_atom_at(fyp,0,1,&fStack_1d8);
          _drc_1._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar3);
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)auStack_98,
                     "block sequence on the same line as a mapping key");
        }
        else if ((fyp->state == FYPS_BLOCK_SEQUENCE_FIRST_ENTRY) ||
                (fyp->state == FYPS_BLOCK_SEQUENCE_ENTRY)) {
          _drc_2.fyt = (fy_token *)0x0;
          _drc_2.has_override = false;
          _drc_2._17_7_ = 0;
          _drc_2.type = FYET_DEBUG;
          _drc_2.module = FYEM_UNKNOWN;
          _drc_2.override_file = (char *)0x0;
          auStack_c8._0_4_ = FYET_ERROR;
          auStack_c8._4_4_ = FYEM_SCAN;
          pfVar3 = fy_fill_atom_at(fyp,0,1,&fStack_1d8);
          _drc_2._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar3);
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)auStack_c8,
                     "block sequence on the same line as a previous item");
        }
        else {
          _drc_4.override_line = 4;
          _drc_4.override_column = 2;
          pfVar3 = fy_fill_atom_at(fyp,0,1,&fStack_1d8);
          fy_token_create(FYTT_INPUT_MARKER,pfVar3);
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)&_drc_4.override_line,
                     "block sequence entries not allowed in this context");
        }
      }
      else {
        uStack_1a0 = 0x142a5d;
        fy_get_mark(fyp,(fy_mark *)&fysk);
        pfVar3 = (fy_atom *)auStack_198;
        if ((fyp->flow_level == 0) && (pfVar3 = (fy_atom *)auStack_198, fyp->indent < fyp->column))
        {
          uStack_1a0 = 0x142a94;
          mark.line = fy_push_indent(fyp,fyp->column,false);
          if (mark.line != 0) {
            uStack_1a0 = 0x142ac7;
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x748,"fy_fetch_block_entry","fy_push_indent() failed");
            return mark.line;
          }
          local_180 = &fyp->queued_tokens;
          pfVar3 = &fStack_1d8;
          local_188 = fyp;
          pfVar4 = fy_fill_atom(fyp,0,pfVar3);
          _drc._32_8_ = fy_token_queue_internal
                                  (local_188,local_180,FYTT_BLOCK_SEQUENCE_START,pfVar4);
          if ((fy_token *)_drc._32_8_ == (fy_token *)0x0) {
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x74d,"fy_fetch_block_entry","fy_token_queue_internal() failed");
            return mark.line;
          }
        }
        *(undefined8 *)&pfVar3[-1].increment = 0x142b73;
        pfVar5 = fy_would_remove_required_simple_key(fyp);
        if (pfVar5 == (fy_simple_key *)0x0) {
          *(undefined8 *)&pfVar3[-1].increment = 0x142d0f;
          mark.line = fy_remove_simple_key(fyp,FYTT_BLOCK_ENTRY);
          if (mark.line != 0) {
            *(undefined8 *)&pfVar3[-1].increment = 0x142d42;
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x769,"fy_fetch_block_entry","fy_remove_simple_key() failed");
            return mark.line;
          }
          *(ushort *)&fyp->field_0x70 = *(ushort *)&fyp->field_0x70 | 8;
          pcVar6 = "false";
          if ((*(uint *)&fyp->field_0x70 >> 3 & 1) != 0) {
            pcVar6 = "true";
          }
          pfVar3[-1].fyi = (fy_input *)pcVar6;
          pfVar3[-1].storage_hint = 0x142da6;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x76c,"fy_fetch_block_entry","simple_key_allowed -> %s\n");
          pfVar3[-2].fyi = (fy_input *)0x142dcc;
          local_190 = fyp;
          pfVar4 = fy_fill_atom(fyp,1,(fy_atom *)&pfVar3[-2].increment);
          pfVar3[-2].fyi = (fy_input *)0x142de2;
          _drc._32_8_ = fy_token_queue(local_190,FYTT_BLOCK_ENTRY,pfVar4);
          if ((fy_token *)_drc._32_8_ == (fy_token *)0x0) {
            pfVar3[-2].fyi = (fy_input *)0x142e17;
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x770,"fy_fetch_block_entry","fy_token_queue() failed");
            return mark.line;
          }
          pfVar3[-2].fyi = (fy_input *)0x142e24;
          mark.column = fy_parse_peek(fyp);
          pfVar3[-2].fyi = (fy_input *)0x142e2e;
          _Var2 = fy_is_ws(mark.column);
          if (_Var2) {
            pfVar3[-2].fyi = (fy_input *)0x142e40;
            fy_advance(fyp,mark.column);
          }
          return 0;
        }
        if (pfVar5->token == (fy_token *)0x0) {
          _drc_6.fyt = (fy_token *)0x0;
          _drc_6.has_override = false;
          _drc_6._17_7_ = 0;
          _drc_6.type = FYET_DEBUG;
          _drc_6.module = FYEM_UNKNOWN;
          _drc_6.override_file = (char *)0x0;
          auStack_178._0_4_ = FYET_ERROR;
          auStack_178._4_4_ = FYEM_SCAN;
          pfVar3[-2].fyi = (fy_input *)0x142ccb;
          pfVar4 = fy_fill_atom_at(fyp,0,1,(fy_atom *)&pfVar3[-2].increment);
          pfVar3[-2].fyi = (fy_input *)0x142cda;
          _drc_6._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar4);
          pfVar3[-2].fyi = (fy_input *)0x142cfa;
          fy_parser_diag_report(fyp,(fy_diag_report_ctx *)auStack_178,"missing \':\'");
        }
        else if ((pfVar5->token->type == FYTT_ANCHOR) || (pfVar5->token->type == FYTT_TAG)) {
          *(undefined8 *)&pfVar3[-1].increment = 0x142bc2;
          memset(&_drc_5.override_line,0,0x28);
          _drc_5.override_line = 4;
          _drc_5.override_column = 2;
          pfVar1 = pfVar5->token;
          *(undefined8 *)&pfVar3[-1].increment = 0x142be3;
          _drc_4._0_8_ = fy_token_ref(pfVar1);
          pcVar6 = "tag";
          if (pfVar5->token->type == FYTT_ANCHOR) {
            pcVar6 = "anchor";
          }
          *(undefined8 *)&pfVar3[-1].increment = 0x142c23;
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)&_drc_5.override_line,
                     "invalid %s indent for sequence",pcVar6);
        }
        else {
          *(undefined8 *)&pfVar3[-1].increment = 0x142c3a;
          memset(local_148,0,0x28);
          local_148._0_4_ = FYET_ERROR;
          local_148._4_4_ = FYEM_SCAN;
          pfVar1 = pfVar5->token;
          *(undefined8 *)&pfVar3[-1].increment = 0x142c5b;
          _drc_5._0_8_ = fy_token_ref(pfVar1);
          *(undefined8 *)&pfVar3[-1].increment = 0x142c7b;
          fy_parser_diag_report(fyp,(fy_diag_report_ctx *)local_148,"missing \':\'");
        }
      }
    }
    else {
      _drc.fyt = (fy_token *)0x0;
      _drc.has_override = false;
      _drc._17_7_ = 0;
      _drc.type = FYET_DEBUG;
      _drc.module = FYEM_UNKNOWN;
      _drc.override_file = (char *)0x0;
      auStack_68._0_4_ = FYET_ERROR;
      auStack_68._4_4_ = FYEM_SCAN;
      pfVar3 = fy_fill_atom_at(fyp,0,1,&fStack_1d8);
      _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar3);
      fy_parser_diag_report
                (fyp,(fy_diag_report_ctx *)auStack_68,"wrongly indented block sequence in flow mode"
                );
    }
  }
  else {
    uStack_1a0 = 0x1427d2;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x72c,"fy_fetch_block_entry","illegal block entry");
  }
  return -1;
}

Assistant:

int fy_fetch_block_entry(struct fy_parser *fyp, int c) {
    int rc;
    struct fy_mark mark;
    struct fy_simple_key *fysk;
    struct fy_token *fyt;

    fyp_error_check(fyp, c == '-', err_out,
                    "illegal block entry");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || (fyp->column + 2) > fyp->indent, err_out,
                          "wrongly indented block sequence in flow mode");

    if (!(fyp->flow_level || fyp->simple_key_allowed)) {
        if (!fyp->simple_key_allowed && fyp->state == FYPS_BLOCK_MAPPING_VALUE)
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence on the same line as a mapping key");
        else if (fyp->state == FYPS_BLOCK_SEQUENCE_FIRST_ENTRY ||
                 fyp->state == FYPS_BLOCK_SEQUENCE_ENTRY)
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence on the same line as a previous item");
        else
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence entries not allowed in this context");
        goto err_out;
    }

    /* we have to save the start mark */
    fy_get_mark(fyp, &mark);

    if (!fyp->flow_level && fyp->indent < fyp->column) {

        /* push the new indent level */
        rc = fy_push_indent(fyp, fyp->column, false);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fyt = fy_token_queue_internal(fyp, &fyp->queued_tokens,
                                      FYTT_BLOCK_SEQUENCE_START, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    if (c == '-' && fyp->flow_level) {
        /* this is an error, but we let the parser catch it */
        ;
    }

    fysk = fy_would_remove_required_simple_key(fyp);

    if (fysk) {
        if (fysk->token) {
            if (fysk->token->type == FYTT_ANCHOR || fysk->token->type == FYTT_TAG)
                FYP_TOKEN_ERROR(fyp, fysk->token, FYEM_SCAN,
                                "invalid %s indent for sequence",
                                fysk->token->type == FYTT_ANCHOR ?
                                "anchor" : "tag");
            else
                FYP_TOKEN_ERROR(fyp, fysk->token, FYEM_SCAN,
                                "missing ':'");
        } else
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "missing ':'");
        goto err_out;
    }

    rc = fy_remove_simple_key(fyp, FYTT_BLOCK_ENTRY);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_remove_simple_key() failed");

    fyp->simple_key_allowed = true;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    fyt = fy_token_queue(fyp, FYTT_BLOCK_ENTRY, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    /* special case for allowing whitespace (including tabs) after - */
    if (fy_is_ws(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}